

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_newslot(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)

{
  SQInteger SVar1;
  SQObjectPtr *self_00;
  SQObjectPtr *key_00;
  SQRESULT SVar2;
  SQObjectPtr *val;
  SQObjectPtr *key;
  SQObjectPtr *self;
  SQBool bstatic_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  SVar1 = sq_gettop(v);
  if (SVar1 < 3) {
    SQVM::Raise_Error(v,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    self_00 = stack_get(v,idx);
    if (((self_00->super_SQObject)._type == OT_TABLE) ||
       ((self_00->super_SQObject)._type == OT_CLASS)) {
      key_00 = SQVM::GetUp(v,-2);
      if ((key_00->super_SQObject)._type == OT_NULL) {
        SVar2 = sq_throwerror(v,"null is not a valid key");
        return SVar2;
      }
      val = SQVM::GetUp(v,-1);
      SQVM::NewSlot(v,self_00,key_00,val,(bool)(-(bstatic != 0) & 1));
      SQVM::Pop(v,2);
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_newslot(HSQUIRRELVM v, SQInteger idx, SQBool bstatic)
{
    sq_aux_paramscheck(v, 3);
    SQObjectPtr &self = stack_get(v, idx);
    if(type(self) == OT_TABLE || type(self) == OT_CLASS) {
        SQObjectPtr &key = v->GetUp(-2);
        if(type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
        v->NewSlot(self, key, v->GetUp(-1),bstatic?true:false);
        v->Pop(2);
    }
    return SQ_OK;
}